

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

_Bool find_any_nearby_injured_kin(chunk *c,monster_conflict *mon)

{
  bool bVar1;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  loc grid;
  bool bVar4;
  wchar_t wVar5;
  
  bVar4 = true;
  wVar2 = (mon->grid).y + L'\xfffffffb';
  do {
    wVar5 = (mon->grid).x + L'\xfffffffa';
    do {
      wVar5 = wVar5 + L'\x01';
      grid.y = wVar2;
      grid.x = wVar5;
      pmVar3 = get_injured_kin(c,mon,grid);
      if (pmVar3 != (monster_conflict *)0x0) {
        return bVar4;
      }
    } while (wVar5 < (mon->grid).x + L'\x05');
    wVar5 = (mon->grid).y + L'\x05';
    bVar4 = wVar2 < wVar5;
    bVar1 = wVar2 < wVar5;
    wVar2 = wVar2 + L'\x01';
  } while (bVar1);
  return bVar4;
}

Assistant:

bool find_any_nearby_injured_kin(struct chunk *c, const struct monster *mon)
{
	struct loc grid;
	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			if (get_injured_kin(c, mon, grid) != NULL) {
				return true;
			}
		}
	}

	return false;
}